

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mtbdd.c
# Opt level: O0

MTBDD mtbdd_refs_push(MTBDD mtbdd)

{
  MTBDD *pMVar1;
  long *in_FS_OFFSET;
  MTBDD mtbdd_local;
  
  if (*(long *)(*in_FS_OFFSET + -0x18) == 0) {
    mtbdd_refs_init_key();
    mtbdd_local = mtbdd_refs_push(mtbdd);
  }
  else {
    pMVar1 = *(MTBDD **)(*(long *)(*in_FS_OFFSET + -0x18) + 0x28);
    *(MTBDD **)(*(long *)(*in_FS_OFFSET + -0x18) + 0x28) = pMVar1 + 1;
    *pMVar1 = mtbdd;
    mtbdd_local = mtbdd;
    if (*(long *)(*(long *)(*in_FS_OFFSET + -0x18) + 0x28) ==
        *(long *)(*(long *)(*in_FS_OFFSET + -0x18) + 0x20)) {
      mtbdd_local = mtbdd_refs_refs_up(*(mtbdd_refs_internal_t *)(*in_FS_OFFSET + -0x18),mtbdd);
    }
  }
  return mtbdd_local;
}

Assistant:

MTBDD __attribute__((unused))
mtbdd_refs_push(MTBDD mtbdd)
{
    LOCALIZE_THREAD_LOCAL(mtbdd_refs_key, mtbdd_refs_internal_t);
    if (mtbdd_refs_key == 0) {
        mtbdd_refs_init_key();
        return mtbdd_refs_push(mtbdd);
    } else {
        *(mtbdd_refs_key->rcur++) = mtbdd;
        if (mtbdd_refs_key->rcur == mtbdd_refs_key->rend) return mtbdd_refs_refs_up(mtbdd_refs_key, mtbdd);
        else return mtbdd;
    }
}